

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evalexpr.c
# Opt level: O2

void expr_eval(astnode *ptr)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  
  lVar3 = 8;
  lVar4 = 0x10;
  do {
    if (ptr == (astnode *)0x0) {
      return;
    }
    iVar2 = ptr->type;
    uVar1 = iVar2 - 0x21;
    lVar5 = lVar4;
    lVar6 = lVar3;
    if (uVar1 < 0x3e) {
      if ((0x2000000028005630U >> ((ulong)uVar1 & 0x3f) & 1) != 0) goto LAB_001050b8;
      if ((ulong)uVar1 != 0) goto LAB_00105071;
    }
    else {
LAB_00105071:
      if (5 < iVar2 - 0x129U) {
        if (iVar2 - 0x12fU < 2) {
          labelcounter = labelcounter + 1;
          lVar5 = lVar3;
          lVar6 = lVar4;
        }
        else if (iVar2 != 0x7c) {
          if ((iVar2 != 0x7e) && (iVar2 != 0x14b)) {
            if (iVar2 == 0x170) {
              return;
            }
            yyerror("Warning: Unknown expression type");
            return;
          }
          goto LAB_001050c1;
        }
      }
LAB_001050b8:
      expr_eval(*(astnode **)((long)&ptr->type + lVar5));
    }
LAB_001050c1:
    ptr = *(astnode **)((long)&ptr->type + lVar6);
  } while( true );
}

Assistant:

void expr_eval(struct astnode *ptr)
{
	
	if(ptr==NULL)
	{
		
		return;
		
	}
	
	switch(ptr->type)
	{
		case LOR:
		{
			int local=labelcounter++;
			expr_eval(ptr->left);
			//logic or evaluation, only evaluate right side if necessary
			expr_eval(ptr->right);
			break;
		}
		case LAND:
		{
			int local=labelcounter++;
			expr_eval(ptr->left);
			//logic and evaluation, only evaluate right side if necessary
			expr_eval(ptr->right);
			break;
		}
		case '|':
			expr_eval(ptr->right);
			expr_eval(ptr->left);
			//OR expression
			break;
			
		case '^':
			expr_eval(ptr->right);
			expr_eval(ptr->left);
			//XOR expression
			break;
			
		case '&':
			expr_eval(ptr->right);
			expr_eval(ptr->left);
			//AND expression
			break;
			
		case EQ:
			expr_eval(ptr->right);
			expr_eval(ptr->left);
			//Equality expression
			break;
			
		case NE:
			expr_eval(ptr->right);
			expr_eval(ptr->left);
			//Non-equality expression
			break;
			
		case '>':
			expr_eval(ptr->right);
			expr_eval(ptr->left);
			//Larger then
			break;
			
		case '<':
			expr_eval(ptr->right);
			expr_eval(ptr->left);
			//Smaller then
			break;
			
		case GE:
			expr_eval(ptr->right);
			expr_eval(ptr->left);
			//Greater then or equal to.
			break;
			
		case LE:
			expr_eval(ptr->right);
			expr_eval(ptr->left);
			//Less then or equal to.
			break;
			
		case SHL:
			expr_eval(ptr->right);
			expr_eval(ptr->left);
			//Shift left
			break;
			
		case SHR:
			expr_eval(ptr->right);
			expr_eval(ptr->left);
			//Shift Right
			break;
			
		case '+':
			expr_eval(ptr->right);
			expr_eval(ptr->left);
			//Add
			break;
			
		case '-':
			expr_eval(ptr->right);
			expr_eval(ptr->left);
			//Subtract
			break;
			
		case '*':
			expr_eval(ptr->right);
			expr_eval(ptr->left);
			//Multiply
			break;
			
		case '/':
			expr_eval(ptr->right);
			expr_eval(ptr->left);
			//Divide
			break;
			
		case '%':
			expr_eval(ptr->right);
			expr_eval(ptr->left);
			//Modulo
			break;	
			
		case NEGATE:
			expr_eval(ptr->left);
			//Negate
			break;
			
		case '~':
			expr_eval(ptr->left);
			//Not
			break;
		
		case '!':
			expr_eval(ptr->left);
			//Logical not
			break;
			
		case ICONSTANT:
		{
			struct numbernode *num=(struct numbernode *)ptr;
			//Get number 
			break;
		}
		default:
			yyerror("Warning: Unknown expression type");
			break;
		
	}
	
	return;
	
}